

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

ostream * notch::io::operator<<(ostream *out,Array *xs)

{
  size_t sVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  
  sVar1 = xs->_M_size;
  pfVar2 = xs->_M_data;
  pfVar4 = pfVar2;
  if (sVar1 == 0) {
    pfVar4 = (float *)0x0;
  }
  while( true ) {
    pfVar3 = pfVar2 + sVar1;
    if (sVar1 == 0) {
      pfVar3 = (float *)0x0;
    }
    if (pfVar4 == pfVar3) break;
    if (sVar1 == 0) {
      pfVar2 = (float *)0x0;
    }
    if (pfVar4 != pfVar2) {
      std::operator<<((ostream *)out," ");
    }
    std::ostream::operator<<(out,*pfVar4);
    sVar1 = xs->_M_size;
    pfVar2 = xs->_M_data;
    pfVar4 = pfVar4 + 1;
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Array &xs) {
    for (auto it = std::begin(xs); it != std::end(xs); ++it) {
        if (it != std::begin(xs)) {
            out << " ";
        }
        out << *it;
    }
    return out;
}